

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool __thiscall
source::judge_file(source *this,Request *request,Response *response,CharContent *file_path)

{
  int iVar1;
  char *__file;
  mapped_type *this_00;
  CharContent local_288;
  CharContent local_260;
  CharContent local_238;
  CharContent local_210;
  char acStack_1e8 [8];
  char etag_buf [200];
  CharContent local_110;
  CharContent local_e8;
  undefined1 local_c0 [8];
  stat file_stat;
  CharContent *file_path_local;
  Response *response_local;
  Request *request_local;
  source *this_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)file_path;
  __file = CharContent::c_str(file_path);
  iVar1 = stat(__file,(stat *)local_c0);
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else if (((uint)file_stat.st_nlink & 0xf000) == 0x4000) {
    CharContent::CharContent(&local_e8,&request->uri);
    CharContent::CharContent(&local_110,file_path);
    this_local._7_1_ = document_iter(this,&local_e8,response,&local_110);
    CharContent::~CharContent(&local_110);
    CharContent::~CharContent(&local_e8);
  }
  else if (((uint)file_stat.st_nlink & 0xf000) == 0x8000) {
    etag_buf[0xa8] = '\0';
    etag_buf[0xa9] = '\0';
    etag_buf[0xaa] = '\0';
    etag_buf[0xab] = '\0';
    etag_buf[0xac] = '\0';
    etag_buf[0xad] = '\0';
    etag_buf[0xae] = '\0';
    etag_buf[0xaf] = '\0';
    etag_buf[0xb0] = '\0';
    etag_buf[0xb1] = '\0';
    etag_buf[0xb2] = '\0';
    etag_buf[0xb3] = '\0';
    etag_buf[0xb4] = '\0';
    etag_buf[0xb5] = '\0';
    etag_buf[0xb6] = '\0';
    etag_buf[0xb7] = '\0';
    etag_buf[0x98] = '\0';
    etag_buf[0x99] = '\0';
    etag_buf[0x9a] = '\0';
    etag_buf[0x9b] = '\0';
    etag_buf[0x9c] = '\0';
    etag_buf[0x9d] = '\0';
    etag_buf[0x9e] = '\0';
    etag_buf[0x9f] = '\0';
    etag_buf[0xa0] = '\0';
    etag_buf[0xa1] = '\0';
    etag_buf[0xa2] = '\0';
    etag_buf[0xa3] = '\0';
    etag_buf[0xa4] = '\0';
    etag_buf[0xa5] = '\0';
    etag_buf[0xa6] = '\0';
    etag_buf[0xa7] = '\0';
    etag_buf[0x88] = '\0';
    etag_buf[0x89] = '\0';
    etag_buf[0x8a] = '\0';
    etag_buf[0x8b] = '\0';
    etag_buf[0x8c] = '\0';
    etag_buf[0x8d] = '\0';
    etag_buf[0x8e] = '\0';
    etag_buf[0x8f] = '\0';
    etag_buf[0x90] = '\0';
    etag_buf[0x91] = '\0';
    etag_buf[0x92] = '\0';
    etag_buf[0x93] = '\0';
    etag_buf[0x94] = '\0';
    etag_buf[0x95] = '\0';
    etag_buf[0x96] = '\0';
    etag_buf[0x97] = '\0';
    etag_buf[0x78] = '\0';
    etag_buf[0x79] = '\0';
    etag_buf[0x7a] = '\0';
    etag_buf[0x7b] = '\0';
    etag_buf[0x7c] = '\0';
    etag_buf[0x7d] = '\0';
    etag_buf[0x7e] = '\0';
    etag_buf[0x7f] = '\0';
    etag_buf[0x80] = '\0';
    etag_buf[0x81] = '\0';
    etag_buf[0x82] = '\0';
    etag_buf[0x83] = '\0';
    etag_buf[0x84] = '\0';
    etag_buf[0x85] = '\0';
    etag_buf[0x86] = '\0';
    etag_buf[0x87] = '\0';
    etag_buf[0x68] = '\0';
    etag_buf[0x69] = '\0';
    etag_buf[0x6a] = '\0';
    etag_buf[0x6b] = '\0';
    etag_buf[0x6c] = '\0';
    etag_buf[0x6d] = '\0';
    etag_buf[0x6e] = '\0';
    etag_buf[0x6f] = '\0';
    etag_buf[0x70] = '\0';
    etag_buf[0x71] = '\0';
    etag_buf[0x72] = '\0';
    etag_buf[0x73] = '\0';
    etag_buf[0x74] = '\0';
    etag_buf[0x75] = '\0';
    etag_buf[0x76] = '\0';
    etag_buf[0x77] = '\0';
    etag_buf[0x58] = '\0';
    etag_buf[0x59] = '\0';
    etag_buf[0x5a] = '\0';
    etag_buf[0x5b] = '\0';
    etag_buf[0x5c] = '\0';
    etag_buf[0x5d] = '\0';
    etag_buf[0x5e] = '\0';
    etag_buf[0x5f] = '\0';
    etag_buf[0x60] = '\0';
    etag_buf[0x61] = '\0';
    etag_buf[0x62] = '\0';
    etag_buf[99] = '\0';
    etag_buf[100] = '\0';
    etag_buf[0x65] = '\0';
    etag_buf[0x66] = '\0';
    etag_buf[0x67] = '\0';
    etag_buf[0x48] = '\0';
    etag_buf[0x49] = '\0';
    etag_buf[0x4a] = '\0';
    etag_buf[0x4b] = '\0';
    etag_buf[0x4c] = '\0';
    etag_buf[0x4d] = '\0';
    etag_buf[0x4e] = '\0';
    etag_buf[0x4f] = '\0';
    etag_buf[0x50] = '\0';
    etag_buf[0x51] = '\0';
    etag_buf[0x52] = '\0';
    etag_buf[0x53] = '\0';
    etag_buf[0x54] = '\0';
    etag_buf[0x55] = '\0';
    etag_buf[0x56] = '\0';
    etag_buf[0x57] = '\0';
    etag_buf[0x38] = '\0';
    etag_buf[0x39] = '\0';
    etag_buf[0x3a] = '\0';
    etag_buf[0x3b] = '\0';
    etag_buf[0x3c] = '\0';
    etag_buf[0x3d] = '\0';
    etag_buf[0x3e] = '\0';
    etag_buf[0x3f] = '\0';
    etag_buf[0x40] = '\0';
    etag_buf[0x41] = '\0';
    etag_buf[0x42] = '\0';
    etag_buf[0x43] = '\0';
    etag_buf[0x44] = '\0';
    etag_buf[0x45] = '\0';
    etag_buf[0x46] = '\0';
    etag_buf[0x47] = '\0';
    etag_buf[0x28] = '\0';
    etag_buf[0x29] = '\0';
    etag_buf[0x2a] = '\0';
    etag_buf[0x2b] = '\0';
    etag_buf[0x2c] = '\0';
    etag_buf[0x2d] = '\0';
    etag_buf[0x2e] = '\0';
    etag_buf[0x2f] = '\0';
    etag_buf[0x30] = '\0';
    etag_buf[0x31] = '\0';
    etag_buf[0x32] = '\0';
    etag_buf[0x33] = '\0';
    etag_buf[0x34] = '\0';
    etag_buf[0x35] = '\0';
    etag_buf[0x36] = '\0';
    etag_buf[0x37] = '\0';
    etag_buf[0x18] = '\0';
    etag_buf[0x19] = '\0';
    etag_buf[0x1a] = '\0';
    etag_buf[0x1b] = '\0';
    etag_buf[0x1c] = '\0';
    etag_buf[0x1d] = '\0';
    etag_buf[0x1e] = '\0';
    etag_buf[0x1f] = '\0';
    etag_buf[0x20] = '\0';
    etag_buf[0x21] = '\0';
    etag_buf[0x22] = '\0';
    etag_buf[0x23] = '\0';
    etag_buf[0x24] = '\0';
    etag_buf[0x25] = '\0';
    etag_buf[0x26] = '\0';
    etag_buf[0x27] = '\0';
    etag_buf[8] = '\0';
    etag_buf[9] = '\0';
    etag_buf[10] = '\0';
    etag_buf[0xb] = '\0';
    etag_buf[0xc] = '\0';
    etag_buf[0xd] = '\0';
    etag_buf[0xe] = '\0';
    etag_buf[0xf] = '\0';
    etag_buf[0x10] = '\0';
    etag_buf[0x11] = '\0';
    etag_buf[0x12] = '\0';
    etag_buf[0x13] = '\0';
    etag_buf[0x14] = '\0';
    etag_buf[0x15] = '\0';
    etag_buf[0x16] = '\0';
    etag_buf[0x17] = '\0';
    acStack_1e8[0] = '\0';
    acStack_1e8[1] = '\0';
    acStack_1e8[2] = '\0';
    acStack_1e8[3] = '\0';
    acStack_1e8[4] = '\0';
    acStack_1e8[5] = '\0';
    acStack_1e8[6] = '\0';
    acStack_1e8[7] = '\0';
    etag_buf[0] = '\0';
    etag_buf[1] = '\0';
    etag_buf[2] = '\0';
    etag_buf[3] = '\0';
    etag_buf[4] = '\0';
    etag_buf[5] = '\0';
    etag_buf[6] = '\0';
    etag_buf[7] = '\0';
    etag_buf[0xb8] = '\0';
    etag_buf[0xb9] = '\0';
    etag_buf[0xba] = '\0';
    etag_buf[0xbb] = '\0';
    etag_buf[0xbc] = '\0';
    etag_buf[0xbd] = '\0';
    etag_buf[0xbe] = '\0';
    etag_buf[0xbf] = '\0';
    snprintf(acStack_1e8,200,"%lx-%lx",file_stat.st_rdev,file_stat.st_atim.tv_nsec);
    CharContent::CharContent(&local_210,acStack_1e8);
    CharContent::CharContent(&local_238,"ETag");
    this_00 = std::
              unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
              ::operator[](&response->headers,&local_238);
    CharContent::operator=(this_00,&local_210);
    CharContent::~CharContent(&local_238);
    CharContent::~CharContent(&local_210);
    CharContent::CharContent(&local_260,file_stat.st_rdev);
    CharContent::operator=(&response->Entity,&local_260);
    CharContent::~CharContent(&local_260);
    CharContent::CharContent(&local_288,file_path);
    this_local._7_1_ = file_iter(this,response,&local_288);
    CharContent::~CharContent(&local_288);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool source::judge_file(Request request,Response *response,CharContent file_path){
	struct stat file_stat;
	if(stat(file_path.c_str(),&file_stat)<0)
		return false;
	if(S_ISDIR(file_stat.st_mode)){
		return this->document_iter(request.uri,response,file_path);
	}
	else if(S_ISREG(file_stat.st_mode)){
		char etag_buf[200]={'\0'};
		snprintf(etag_buf,sizeof(etag_buf),"%lx-%lx",file_stat.st_size,file_stat.st_mtim.tv_sec);
		response->headers["ETag"]=CharContent(etag_buf);
		response->Entity=CharContent(file_stat.st_size);
		return this->file_iter(response,file_path);
	}
	return false;
}